

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

SPIRVariable * __thiscall
spirv_cross::CompilerGLSL::find_color_output_by_location(CompilerGLSL *this,uint32_t location)

{
  uint uVar1;
  size_t sVar2;
  TypedID<(spirv_cross::Types)0> *pTVar3;
  Variant *pVVar4;
  uint32_t uVar5;
  SPIRVariable *pSVar6;
  long lVar7;
  SPIRVariable *pSVar8;
  LoopLock loop_lock;
  LoopLock local_38;
  
  ParsedIR::create_loop_hard_lock(&(this->super_Compiler).ir);
  sVar2 = (this->super_Compiler).ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar2 == 0) {
    pSVar8 = (SPIRVariable *)0x0;
  }
  else {
    pTVar3 = (this->super_Compiler).ir.ids_for_type[2].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    lVar7 = 0;
    pSVar8 = (SPIRVariable *)0x0;
    do {
      uVar1 = *(uint *)((long)&pTVar3->id + lVar7);
      pVVar4 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
      if (((pVVar4[uVar1].type == TypeVariable) &&
          (pSVar6 = Variant::get<spirv_cross::SPIRVariable>(pVVar4 + uVar1),
          pSVar6->storage == StorageClassOutput)) &&
         (uVar5 = Compiler::get_decoration
                            (&this->super_Compiler,(ID)(pSVar6->super_IVariant).self.id,
                             DecorationLocation), uVar5 == location)) {
        pSVar8 = pSVar6;
      }
      lVar7 = lVar7 + 4;
    } while (sVar2 << 2 != lVar7);
  }
  ParsedIR::LoopLock::~LoopLock(&local_38);
  return pSVar8;
}

Assistant:

const SPIRVariable *CompilerGLSL::find_color_output_by_location(uint32_t location) const
{
	const SPIRVariable *ret = nullptr;
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, const SPIRVariable &var) {
		if (var.storage == StorageClassOutput && get_decoration(var.self, DecorationLocation) == location)
			ret = &var;
	});
	return ret;
}